

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

any * __thiscall
Omega_h::InputYamlReader::at_reduce
          (any *__return_storage_ptr__,InputYamlReader *this,int prod,
          vector<Omega_h::any,_std::allocator<Omega_h::any>_> *rhs)

{
  size_t parent_indent_level;
  long lVar1;
  bool bVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  type_info *ptVar5;
  reference pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *leading_empties_or_comments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest;
  reference pvVar7;
  InputMap *pIVar8;
  ostream *poVar9;
  ParserFail *this_00;
  undefined8 uVar10;
  size_type sVar11;
  size_type sVar12;
  char *pcVar13;
  size_type sStackY_1f0;
  string ignored_comment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  pointer psStack_198;
  _Base_ptr local_190;
  _Base_ptr local_188;
  _Base_ptr local_180;
  size_t local_178;
  
  switch(prod) {
  case 0:
  case 1:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,(ulong)(prod == 1));
    if (pvVar3->vtable == (vtable_type *)0x0) {
      pcVar13 = "!rhs.at(offset).empty()";
      uVar10 = 0x178;
LAB_002ab606:
      fail("assertion %s failed at %s +%d\n",pcVar13,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,uVar10);
    }
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,(ulong)(prod == 1));
    if (pvVar3->vtable == (vtable_type *)0x0) {
      ptVar5 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar5 = (*pvVar3->vtable->type)();
    }
    bVar2 = std::type_info::operator==(ptVar5,(type_info *)&InputMap::typeinfo);
    if (!bVar2) {
      pcVar13 = "result_any.type() == typeid(InputMap)";
      uVar10 = 0x17a;
      goto LAB_002ab606;
    }
    pIVar8 = any_cast<Omega_h::InputMap&>(pvVar3);
    (pIVar8->super_Input).used = true;
    goto LAB_002aadd0;
  case 2:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    if (pvVar3->vtable == (vtable_type *)0x0) {
      ptVar5 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar5 = (*pvVar3->vtable->type)();
    }
    bVar2 = std::type_info::operator==(ptVar5,(type_info *)&NameValue::typeinfo);
    if (bVar2) {
      pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
LAB_002ab534:
      map_first_item(__return_storage_ptr__,this,pvVar3);
      return __return_storage_ptr__;
    }
  default:
    __return_storage_ptr__->vtable = (vtable_type *)0x0;
    break;
  case 3:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    if (pvVar3->vtable == (vtable_type *)0x0) {
      ptVar5 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar5 = (*pvVar3->vtable->type)();
    }
    bVar2 = std::type_info::operator==(ptVar5,(type_info *)&NameValue::typeinfo);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    if (bVar2) {
      if (pvVar3->vtable == (vtable_type *)0x0) {
        ptVar5 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar5 = (*pvVar3->vtable->type)();
      }
      bVar2 = std::type_info::operator==(ptVar5,(type_info *)&InputMap::typeinfo);
      pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
      if (!bVar2) goto LAB_002ab534;
      goto LAB_002ab03f;
    }
    goto LAB_002aadd0;
  case 7:
  case 0x2b:
  case 0x2d:
  case 0x39:
  case 0x41:
  case 0x53:
  case 0x57:
  case 0x5a:
  case 0x5b:
  case 0x5d:
  case 0x60:
  case 100:
  case 0x71:
    sStackY_1f0 = 0;
    goto LAB_002aadc5;
  case 8:
  case 0x1e:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    if (pvVar3->vtable == (vtable_type *)0x0) {
      ptVar5 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar5 = (*pvVar3->vtable->type)();
    }
    bVar2 = std::type_info::operator==(ptVar5,(type_info *)&NameValue::typeinfo);
    if (!bVar2) {
      pcVar13 = "rhs.at(0).type() == typeid(NameValue)";
      uVar10 = 0x195;
      goto LAB_002ab606;
    }
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    map_first_item(__return_storage_ptr__,this,pvVar3);
    if (__return_storage_ptr__->vtable == (vtable_type *)0x0) {
      ptVar5 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar5 = (*__return_storage_ptr__->vtable->type)();
    }
    bVar2 = std::type_info::operator==(ptVar5,(type_info *)&InputMap::typeinfo);
    if (!bVar2) {
      fail("assertion %s failed at %s +%d\n","result_any.type() == typeid(InputMap)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,0x197);
    }
    break;
  case 9:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
LAB_002ab03f:
    sStackY_1f0 = 1;
    goto LAB_002ab041;
  case 10:
  case 0xc:
  case 0x10:
  case 0x11:
  case 0x20:
  case 0x21:
  case 0x22:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    sStackY_1f0 = 4;
    goto LAB_002aab37;
  case 0xb:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    sStackY_1f0 = 3;
LAB_002aab37:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,sStackY_1f0);
    map_item(__return_storage_ptr__,this,pvVar3,pvVar7);
    break;
  case 0xd:
    local_188 = (_Base_ptr)&psStack_198;
    str.field_2._8_8_ = 0;
    psStack_198 = (pointer)0x0;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = 0;
    str._M_dataplus._M_p = (pointer)&PTR__InputMap_004108d8;
    local_190 = (_Base_ptr)0x0;
    local_178 = 0;
    local_180 = local_188;
    any::construct<Omega_h::InputMap>(__return_storage_ptr__,(InputMap *)&str);
    goto LAB_002ab108;
  case 0xe:
  case 0xf:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x3c:
    sStackY_1f0 = 1;
    goto LAB_002aadc5;
  case 0x12:
  case 0x25:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    seq_first_item(__return_storage_ptr__,this,pvVar3);
    break;
  case 0x13:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    sStackY_1f0 = 1;
    goto LAB_002ab289;
  case 0x14:
  case 0x16:
  case 0x18:
  case 0x1a:
  case 0x1b:
    sStackY_1f0 = 3;
    goto LAB_002aadc5;
  case 0x15:
  case 0x1c:
  case 0x23:
  case 0x37:
    sStackY_1f0 = 2;
    goto LAB_002aadc5;
  case 0x17:
  case 0x19:
    sStackY_1f0 = 4;
LAB_002aadc5:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,sStackY_1f0);
LAB_002aadd0:
    any::any(__return_storage_ptr__,pvVar3);
    break;
  case 0x1d:
    local_188 = (_Base_ptr)&psStack_198;
    str.field_2._8_8_ = 0;
    psStack_198 = (pointer)0x0;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = 0;
    str._M_dataplus._M_p = (pointer)&PTR__InputMap_004108d8;
    local_190 = (_Base_ptr)0x0;
    local_178 = 0;
    local_180 = local_188;
    any::construct<Omega_h::InputMap>(__return_storage_ptr__,(InputMap *)&str);
LAB_002ab108:
    InputMap::~InputMap((InputMap *)&str);
    break;
  case 0x1f:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    sStackY_1f0 = 3;
LAB_002ab041:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,sStackY_1f0);
    map_next_item(__return_storage_ptr__,this,pvVar3,pvVar7);
    break;
  case 0x24:
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = 0;
    str._M_dataplus._M_p = (pointer)&PTR__InputList_00410900;
    str.field_2._8_8_ = 0;
    psStack_198 = (pointer)0x0;
    local_190 = (_Base_ptr)0x0;
    any::construct<Omega_h::InputList>(__return_storage_ptr__,(InputList *)&str);
    InputList::~InputList((InputList *)&str);
    break;
  case 0x26:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    sStackY_1f0 = 3;
LAB_002ab289:
    pvVar7 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,sStackY_1f0);
    seq_next_item(__return_storage_ptr__,this,pvVar3,pvVar7);
    break;
  case 0x2a:
  case 0x2c:
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = (ulong)(uint7)str.field_2._M_allocated_capacity._1_7_ << 8;
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    if (pvVar3->vtable == (vtable_type *)0x0) {
      fail("assertion %s failed at %s +%d\n","!rhs.at(0).empty()",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,0x1fb);
    }
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar4 = any_cast<std::__cxx11::string&&>(pvVar3);
    std::__cxx11::string::operator=((string *)&str,(string *)pbVar4);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any_cast<std::__cxx11::string&>(pvVar3);
    std::__cxx11::string::append((string *)&str);
    sVar11 = str._M_string_length;
    if (prod == 0x2c) {
      pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
      any_cast<std::__cxx11::string&>(pvVar3);
      std::__cxx11::string::append((string *)&str);
      sVar11 = str._M_string_length;
    }
    do {
      sVar12 = sVar11 - 1;
      if (sVar11 == 0) break;
      lVar1 = sVar11 - 1;
      sVar11 = sVar12;
    } while ((str._M_dataplus._M_p[lVar1] == ' ') || (str._M_dataplus._M_p[lVar1] == '\t'));
    std::__cxx11::string::substr((ulong)&ignored_comment,(ulong)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&ignored_comment);
    goto LAB_002ab23e;
  case 0x2e:
  case 0x2f:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    pbVar4 = any_cast<std::__cxx11::string&&>(pvVar3);
    std::__cxx11::string::string((string *)&str,(string *)pbVar4);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    any_cast<std::__cxx11::string&>(pvVar3);
    std::__cxx11::string::append((string *)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x30:
    sStackY_1f0 = 0;
    goto LAB_002ab2fe;
  case 0x31:
  case 0x32:
    sStackY_1f0 = 1;
    goto LAB_002ab2fe;
  case 0x33:
    sStackY_1f0 = 2;
LAB_002ab2fe:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,sStackY_1f0);
    any_cast<char>(pvVar3);
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = str.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (prod == 0x33) {
      std::__cxx11::string::append((char *)&str);
    }
    else if ((prod == 0x32) || (prod == 0x31)) {
      std::__cxx11::string::push_back((char)&str);
    }
    std::__cxx11::string::push_back((char)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x34:
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = (ulong)(uint7)str.field_2._M_allocated_capacity._1_7_ << 8;
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x35:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar4 = any_cast<std::__cxx11::string&&>(pvVar3);
    std::__cxx11::string::string((string *)&str,(string *)pbVar4);
    std::__cxx11::string::push_back((char)&str);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    any_cast<std::__cxx11::string&>(pvVar3);
    std::__cxx11::string::append((string *)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x38:
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&(this->super_Reader).symbol_indentation_stack,
                        ((long)(this->super_Reader).symbol_indentation_stack.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_Reader).symbol_indentation_stack.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) - 5);
    parent_indent_level = *pvVar6;
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar4 = any_cast<std::__cxx11::string&>(pvVar3);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    leading_empties_or_comments = any_cast<std::__cxx11::string&>(pvVar3);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,4);
    rest = any_cast<std::__cxx11::string&>(pvVar3);
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = str.field_2._M_allocated_capacity & 0xffffffffffffff00;
    ignored_comment._M_dataplus._M_p = (pointer)&ignored_comment.field_2;
    ignored_comment._M_string_length = 0;
    ignored_comment.field_2._M_local_buf[0] = '\0';
    handle_block_scalar(this,parent_indent_level,pbVar4,leading_empties_or_comments,rest,&str,
                        &ignored_comment);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
LAB_002ab23e:
    std::__cxx11::string::~string((string *)&ignored_comment);
    goto LAB_002ab3a2;
  case 0x3a:
  case 0x3b:
  case 0x4a:
  case 0x4d:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar4 = any_cast<std::__cxx11::string&&>(pvVar3);
    std::__cxx11::string::string((string *)&str,(string *)pbVar4);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any_cast<std::__cxx11::string&>(pvVar3);
    std::__cxx11::string::append((string *)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x3d:
  case 0x3e:
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = (ulong)(uint7)str.field_2._M_allocated_capacity._1_7_ << 8;
    std::__cxx11::string::append((char *)&str);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any_cast<std::__cxx11::string&>(pvVar3);
    std::__cxx11::string::append((string *)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x3f:
  case 0x43:
  case 0x45:
  case 0x47:
  case 0x49:
  case 0x4c:
  case 0x4f:
  case 0x72:
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = (ulong)(uint7)str.field_2._M_allocated_capacity._1_7_ << 8;
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x40:
  case 0x44:
  case 0x46:
  case 0x48:
  case 0x50:
  case 0x73:
  case 0x75:
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    if (pvVar3->vtable == (vtable_type *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&str);
      poVar9 = std::operator<<((ostream *)str.field_2._M_local_buf,"leading characters in ");
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,prod);
      std::operator<<(poVar9,": any was empty\n");
      this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      ParserFail::ParserFail(this_00,&ignored_comment);
      __cxa_throw(this_00,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    pbVar4 = any_cast<std::__cxx11::string&&>(pvVar3);
    std::__cxx11::string::string((string *)&str,(string *)pbVar4);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any_cast<char>(pvVar3);
    std::__cxx11::string::push_back((char)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x42:
  case 0x55:
  case 0x67:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x2d;
    break;
  case 0x4b:
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = (ulong)(uint7)str.field_2._M_allocated_capacity._1_7_ << 8;
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    any_cast<std::__cxx11::string&>(pvVar3);
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,1);
    any_cast<char>(pvVar3);
    std::__cxx11::string::push_back((char)&str);
    std::__cxx11::string::append((string *)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x4e:
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = (ulong)(uint7)str.field_2._M_allocated_capacity._1_7_ << 8;
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,2);
    any_cast<std::__cxx11::string&>(pvVar3);
    std::__cxx11::string::push_back((char)&str);
    std::__cxx11::string::append((string *)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
    goto LAB_002ab3a2;
  case 0x51:
  case 0x74:
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = (ulong)(uint7)str.field_2._M_allocated_capacity._1_7_ << 8;
    pvVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(rhs,0);
    any_cast<char>(pvVar3);
    std::__cxx11::string::push_back((char)&str);
    any::construct<std::__cxx11::string>(__return_storage_ptr__,&str);
LAB_002ab3a2:
    std::__cxx11::string::~string((string *)&str);
    break;
  case 0x54:
  case 0x66:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x2e;
    break;
  case 0x56:
  case 0x5c:
  case 0x62:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x27;
    break;
  case 0x58:
  case 0x5e:
  case 0x61:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x22;
    break;
  case 0x59:
  case 0x5f:
  case 99:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x5c;
    break;
  case 0x65:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x3a;
    break;
  case 0x68:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x7c;
    break;
  case 0x69:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x5b;
    break;
  case 0x6a:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x5d;
    break;
  case 0x6b:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x7b;
    break;
  case 0x6c:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x7d;
    break;
  case 0x6d:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x3e;
    break;
  case 0x6e:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x2c;
    break;
  case 0x6f:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x25;
    break;
  case 0x70:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x21;
  }
  return __return_storage_ptr__;
}

Assistant:

any at_reduce(int prod, std::vector<any>& rhs) override final {
    switch (prod) {
      case yaml::PROD_DOC:
      case yaml::PROD_DOC2: {
        std::size_t offset = prod == yaml::PROD_DOC2 ? 1 : 0;
        OMEGA_H_CHECK(!rhs.at(offset).empty());
        auto& result_any = rhs.at(offset);
        OMEGA_H_CHECK(result_any.type() == typeid(InputMap));
        auto& map = any_cast<InputMap&>(result_any);
        map.used = true;
        return any(std::move(result_any));
      }
      case yaml::PROD_TOP_BMAP: {
        return any(std::move(rhs.at(0)));
      }
      case yaml::PROD_TOP_FIRST: {
        if (rhs.at(0).type() == typeid(NameValue)) {
          return map_first_item(rhs.at(0));
        }
        return any();
      }
      case yaml::PROD_TOP_NEXT: {
        if (rhs.at(1).type() == typeid(NameValue)) {
          if (rhs.at(0).type() == typeid(InputMap)) {
            return map_next_item(rhs.at(0), rhs.at(1));
          } else {
            return map_first_item(rhs.at(0));
          }
        } else {
          return any(std::move(rhs.at(0)));
        }
      }
      case yaml::PROD_BMAP_FIRST:
      case yaml::PROD_FMAP_FIRST: {
        OMEGA_H_CHECK(rhs.at(0).type() == typeid(NameValue));
        auto result_any = map_first_item(rhs.at(0));
        OMEGA_H_CHECK(result_any.type() == typeid(InputMap));
        return result_any;
      }
      case yaml::PROD_BMAP_NEXT: {
        return map_next_item(rhs.at(0), rhs.at(1));
      }
      case yaml::PROD_FMAP_NEXT: {
        return map_next_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_BMAP_SCALAR:
      case yaml::PROD_FMAP_SCALAR: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_FMAP_FMAP: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_FMAP_FSEQ: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BMAP_BSCALAR: {
        return map_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_BMAP_BVALUE: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BVALUE_EMPTY: {
        return InputMap();
      }
      case yaml::PROD_BVALUE_BMAP: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BVALUE_BSEQ: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BMAP_FMAP: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BMAP_FSEQ: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BSEQ_FIRST: {
        return seq_first_item(rhs.at(0));
      }
      case yaml::PROD_BSEQ_NEXT: {
        return seq_next_item(rhs.at(0), rhs.at(1));
      }
      case yaml::PROD_BSEQ_SCALAR: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BSCALAR: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_BSEQ_BMAP:
      case yaml::PROD_BSEQ_FMAP: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BMAP_TRAIL: {
        return any(std::move(rhs.at(4)));
      }
      case yaml::PROD_BSEQ_BSEQ:
      case yaml::PROD_BSEQ_FSEQ: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BSEQ_TRAIL: {
        return any(std::move(rhs.at(4)));
      }
      case yaml::PROD_FMAP: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_FMAP_EMPTY: {
        return InputMap();
      }
      case yaml::PROD_FSEQ: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_FSEQ_EMPTY: {
        return InputList();
      }
      case yaml::PROD_FSEQ_FIRST: {
        return seq_first_item(rhs.at(0));
      }
      case yaml::PROD_FSEQ_NEXT: {
        return seq_next_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_FSEQ_SCALAR: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_FSEQ_FSEQ: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_FSEQ_FMAP: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_SCALAR_QUOTED:
      case yaml::PROD_MAP_SCALAR_QUOTED: {
        return any(std::move(rhs.at(0)));
      }
      case yaml::PROD_SCALAR_RAW:
      case yaml::PROD_MAP_SCALAR_RAW: {
        std::string text;
        OMEGA_H_CHECK(!rhs.at(0).empty());
        text = any_cast<std::string&&>(std::move(rhs.at(0)));
        text += any_cast<std::string&>(rhs.at(1));
        if (prod == yaml::PROD_MAP_SCALAR_RAW) {
          text += any_cast<std::string&>(rhs.at(2));
        }
        return remove_trailing_whitespace(text);
      }
      case yaml::PROD_SCALAR_HEAD_OTHER:
      case yaml::PROD_SCALAR_HEAD_DOT:
      case yaml::PROD_SCALAR_HEAD_DASH:
      case yaml::PROD_SCALAR_HEAD_DOT_DOT: {
        std::size_t offset;
        if (prod == yaml::PROD_SCALAR_HEAD_OTHER)
          offset = 0;
        else if (prod == yaml::PROD_SCALAR_HEAD_DOT_DOT)
          offset = 2;
        else
          offset = 1;
        char second = any_cast<char>(rhs.at(offset));
        std::string result;
        if (prod == yaml::PROD_SCALAR_HEAD_DOT)
          result += '.';
        else if (prod == yaml::PROD_SCALAR_HEAD_DASH)
          result += '-';
        else if (prod == yaml::PROD_SCALAR_HEAD_DOT_DOT)
          result += "..";
        result += second;
        return any(std::move(result));
      }
      case yaml::PROD_SCALAR_DQUOTED:
      case yaml::PROD_SCALAR_SQUOTED: {
        auto text = any_cast<std::string&&>(std::move(rhs.at(1)));
        text += any_cast<std::string&>(rhs.at(2));
        return any(std::move(text));
      }
      case yaml::PROD_MAP_SCALAR_ESCAPED_EMPTY: {
        return std::string();
      }
      case yaml::PROD_MAP_SCALAR_ESCAPED_NEXT: {
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += ',';
        str += any_cast<std::string&>(rhs.at(2));
        return any(std::move(str));
      }
      case yaml::PROD_TAG: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_BSCALAR: {
        auto parent_indent_level = this->symbol_indentation_stack.at(
            this->symbol_indentation_stack.size() - 5);
        auto& header = any_cast<std::string&>(rhs.at(0));
        auto& leading_empties_or_comments = any_cast<std::string&>(rhs.at(2));
        auto& rest = any_cast<std::string&>(rhs.at(4));
        std::string content;
        std::string ignored_comment;
        handle_block_scalar(parent_indent_level, header,
            leading_empties_or_comments, rest, content, ignored_comment);
        return any(std::move(content));
      }
      case yaml::PROD_BSCALAR_FIRST: {
        return any(std::move(rhs.at(0)));
      }
      // all these cases reduce to concatenating two strings
      case yaml::PROD_BSCALAR_NEXT:
      case yaml::PROD_BSCALAR_LINE:
      case yaml::PROD_DESCAPE_NEXT:
      case yaml::PROD_SESCAPE_NEXT: {
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += any_cast<std::string&>(rhs.at(1));
        return any(std::move(str));
      }
      case yaml::PROD_BSCALAR_INDENT: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BSCALAR_HEADER_LITERAL:
      case yaml::PROD_BSCALAR_HEADER_FOLDED: {
        std::string result;
        if (prod == yaml::PROD_BSCALAR_HEADER_LITERAL) {
          result += "|";
        } else {
          result += ">";
        }
        auto& rest = any_cast<std::string&>(rhs.at(1));
        result += rest;
        return any(std::move(result));
      }
      case yaml::PROD_DESCAPE: {
        std::string str;
        auto& rest = any_cast<std::string&>(rhs.at(2));
        str += any_cast<char>(rhs.at(1));
        str += rest;
        return any(std::move(str));
      }
      case yaml::PROD_SESCAPE: {
        std::string str;
        auto& rest = any_cast<std::string&>(rhs.at(2));
        str += '\'';
        str += rest;
        return any(std::move(str));
      }
      case yaml::PROD_OTHER_FIRST:
      case yaml::PROD_SPACE_PLUS_FIRST: {
        std::string str;
        str.push_back(any_cast<char>(rhs.at(0)));
        return any(std::move(str));
      }
      case yaml::PROD_SCALAR_TAIL_SPACE:
      case yaml::PROD_SCALAR_TAIL_OTHER:
      case yaml::PROD_DESCAPED_DQUOTED:
      case yaml::PROD_DQUOTED_COMMON:
      case yaml::PROD_SQUOTED_COMMON:
      case yaml::PROD_ANY_COMMON:
      case yaml::PROD_COMMON_SPACE:
      case yaml::PROD_COMMON_OTHER:
      case yaml::PROD_BSCALAR_HEAD_OTHER: {
        return any(std::move(rhs.at(0)));
      }
      // all these cases reduce to appending a character
      case yaml::PROD_DQUOTED_NEXT:
      case yaml::PROD_SQUOTED_NEXT:
      case yaml::PROD_ANY_NEXT:
      case yaml::PROD_SCALAR_TAIL_NEXT:
      case yaml::PROD_SPACE_STAR_NEXT:
      case yaml::PROD_SPACE_PLUS_NEXT:
      case yaml::PROD_BSCALAR_HEAD_NEXT: {
        if (rhs.at(0).empty()) {
          std::stringstream ss;
          ss << "leading characters in " << prod << ": any was empty\n";
          throw ParserFail(ss.str());
        }
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += any_cast<char>(rhs.at(1));
        return any(std::move(str));
      }
      case yaml::PROD_DQUOTED_EMPTY:
      case yaml::PROD_SQUOTED_EMPTY:
      case yaml::PROD_ANY_EMPTY:
      case yaml::PROD_DESCAPE_EMPTY:
      case yaml::PROD_SESCAPE_EMPTY:
      case yaml::PROD_SCALAR_TAIL_EMPTY:
      case yaml::PROD_SPACE_STAR_EMPTY:
      case yaml::PROD_BSCALAR_HEAD_EMPTY: {
        return std::string();
      }
      case yaml::PROD_DESCAPED_DQUOT:
      case yaml::PROD_SQUOTED_DQUOT:
      case yaml::PROD_ANY_DQUOT: {
        return '"';
      }
      case yaml::PROD_DESCAPED_SLASH:
      case yaml::PROD_SQUOTED_SLASH:
      case yaml::PROD_ANY_SLASH: {
        return '\\';
      }
      case yaml::PROD_SCALAR_TAIL_SQUOT:
      case yaml::PROD_DQUOTED_SQUOT:
      case yaml::PROD_ANY_SQUOT: {
        return '\'';
      }
      case yaml::PROD_COMMON_COLON: {
        return ':';
      }
      case yaml::PROD_SCALAR_TAIL_DOT:
      case yaml::PROD_COMMON_DOT: {
        return '.';
      }
      case yaml::PROD_SCALAR_TAIL_DASH:
      case yaml::PROD_COMMON_DASH:
      case yaml::PROD_BSCALAR_HEAD_DASH: {
        return '-';
      }
      case yaml::PROD_COMMON_PIPE: {
        return '|';
      }
      case yaml::PROD_COMMON_LSQUARE: {
        return '[';
      }
      case yaml::PROD_COMMON_RSQUARE: {
        return ']';
      }
      case yaml::PROD_COMMON_LCURLY: {
        return '{';
      }
      case yaml::PROD_COMMON_RCURLY: {
        return '}';
      }
      case yaml::PROD_COMMON_RANGLE: {
        return '>';
      }
      case yaml::PROD_COMMON_COMMA: {
        return ',';
      }
      case yaml::PROD_COMMON_PERCENT: {
        return '%';
      }
      case yaml::PROD_COMMON_EXCL: {
        return '!';
      }
    }
    return any();
  }